

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void SelectParams(ChainType chain)

{
  undefined8 __p;
  long in_FS_OFFSET;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  SelectBaseParams(chain);
  CreateChainParams((ArgsManager *)&stack0xffffffffffffffe0,0x6bc9a8);
  __p = local_20;
  local_20 = 0;
  std::__uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>::reset
            ((__uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             &globalChainParams,(pointer)__p);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             &stack0xffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectParams(const ChainType chain)
{
    SelectBaseParams(chain);
    globalChainParams = CreateChainParams(gArgs, chain);
}